

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O0

IGUIEditBox * __thiscall
irr::gui::CGUIEnvironment::addEditBox
          (CGUIEnvironment *this,wchar_t *text,rect<int> *rectangle,bool border,IGUIElement *parent,
          s32 id)

{
  byte bVar1;
  IGUIEditBox *pIVar2;
  byte in_CL;
  IReferenceCounted *in_RDX;
  rect<int> *in_RSI;
  wchar_t *in_R8;
  undefined4 in_R9D;
  undefined1 border_00;
  IGUIEditBox *d;
  undefined7 in_stack_ffffffffffffffc0;
  IGUIEnvironment *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffe0;
  
  border_00 = (undefined1)((uint)in_R9D >> 0x18);
  bVar1 = in_CL & 1;
  pIVar2 = (IGUIEditBox *)operator_new(0x220);
  CGUIEditBox::CGUIEditBox
            ((CGUIEditBox *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),in_R8,(bool)border_00,
             in_stack_ffffffffffffffc8,(IGUIElement *)CONCAT17(bVar1,in_stack_ffffffffffffffc0),
             (s32)((ulong)in_RSI >> 0x20),in_RSI);
  IReferenceCounted::drop(in_RDX);
  return pIVar2;
}

Assistant:

IGUIEditBox *CGUIEnvironment::addEditBox(const wchar_t *text,
		const core::rect<s32> &rectangle, bool border,
		IGUIElement *parent, s32 id)
{
	IGUIEditBox *d = new CGUIEditBox(text, border, this,
			parent ? parent : this, id, rectangle);

	d->drop();
	return d;
}